

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  DIdxSet *this_00;
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  pointer pnVar6;
  undefined8 uVar7;
  int *piVar8;
  type_conflict5 tVar9;
  DataKey DVar10;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  ulong uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  ulong uVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  int local_264;
  ulong local_260;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  steeppr local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  undefined8 uStack_110;
  undefined8 local_108;
  int local_100;
  undefined1 local_fc;
  fpclass_type local_f8;
  int32_t iStack_f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar6 = (pSVar4->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_250 = best;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  local_2a8.m_backend.fpclass = cpp_dec_float_finite;
  local_2a8.m_backend.prec_elem = 10;
  local_2a8.m_backend.data._M_elems[0] = 0;
  local_2a8.m_backend.data._M_elems[1] = 0;
  local_2a8.m_backend.data._M_elems[2] = 0;
  local_2a8.m_backend.data._M_elems[3] = 0;
  local_2a8.m_backend.data._M_elems[4] = 0;
  local_2a8.m_backend.data._M_elems[5] = 0;
  local_2a8.m_backend.data._M_elems._24_5_ = 0;
  local_2a8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_2a8.m_backend.data._M_elems._32_5_ = 0;
  local_2a8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_2a8.m_backend.exp = 0;
  local_2a8.m_backend.neg = false;
  uVar12 = (ulong)(uint)(this->bestPrices).super_IdxSet.num;
  local_264 = -1;
  local_258 = this;
LAB_0026a813:
  uVar13 = uVar12 & 0xffffffff;
  while( true ) {
    uVar12 = uVar12 - 1;
    if ((int)uVar13 < 1) {
      this_00 = &local_258->bestPrices;
      uVar12 = (ulong)(uint)(((local_258->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->updateViols).super_IdxSet.num;
      pSVar11 = local_258;
      goto LAB_0026ab4e;
    }
    iVar2 = (local_258->bestPrices).super_IdxSet.idx[uVar12];
    local_260 = CONCAT44(local_260._4_4_,iVar2);
    uVar7 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_2a8.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_2a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_2a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    local_2a8.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_2a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_2a8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_2a8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_2a8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_2a8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (tol->m_backend).exp;
    result.m_backend.neg = (tol->m_backend).neg;
    result.m_backend.fpclass = (tol->m_backend).fpclass;
    result.m_backend.prec_elem = (tol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar9 = boost::multiprecision::operator<(&local_2a8,&result);
    if (tVar9) break;
    piVar8 = (local_258->bestPrices).super_IdxSet.idx;
    iVar3 = (local_258->bestPrices).super_IdxSet.num;
    (local_258->bestPrices).super_IdxSet.num = iVar3 + -1;
    piVar8[uVar12] = piVar8[(long)iVar3 + -1];
    (((local_258->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data[iVar2] = 0;
    uVar13 = (ulong)((int)uVar13 - 1);
  }
  uStack_50 = CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                       local_2a8.m_backend.data._M_elems._24_5_);
  local_68 = (steeppr  [8])local_2a8.m_backend.data._M_elems._0_8_;
  auStack_60[0] = local_2a8.m_backend.data._M_elems[2];
  auStack_60[1] = local_2a8.m_backend.data._M_elems[3];
  local_58[0] = local_2a8.m_backend.data._M_elems[4];
  local_58[1] = local_2a8.m_backend.data._M_elems[5];
  local_48 = CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                      local_2a8.m_backend.data._M_elems._32_5_);
  local_40 = local_2a8.m_backend.exp;
  local_3c = local_2a8.m_backend.neg;
  local_38 = local_2a8.m_backend.fpclass;
  iStack_34 = local_2a8.m_backend.prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[iVar2].m_backend.data;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[iVar2].m_backend.data + 0x10);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 0x20);
  local_a8.m_backend.exp = pnVar6[iVar2].m_backend.exp;
  local_a8.m_backend.neg = pnVar6[iVar2].m_backend.neg;
  local_a8.m_backend.fpclass = pnVar6[iVar2].m_backend.fpclass;
  local_a8.m_backend.prec_elem = pnVar6[iVar2].m_backend.prec_elem;
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (tol->m_backend).exp;
  local_e8.m_backend.neg = (tol->m_backend).neg;
  local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
  steeppr::
  computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&result,local_68,&local_a8,&local_e8,in_R8);
  local_2a8.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_2a8.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_2a8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_2a8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_2a8.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
  local_2a8.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
  local_2a8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_2a8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_2a8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_2a8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_2a8.m_backend.exp = result.m_backend.exp;
  local_2a8.m_backend.neg = result.m_backend.neg;
  local_2a8.m_backend.fpclass = result.m_backend.fpclass;
  local_2a8.m_backend.prec_elem = result.m_backend.prec_elem;
  tVar9 = boost::multiprecision::operator>(&local_2a8,local_250);
  if (tVar9) {
    *(ulong *)((local_250->m_backend).data._M_elems + 8) =
         CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                  local_2a8.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((local_250->m_backend).data._M_elems + 4) =
         local_2a8.m_backend.data._M_elems._16_8_;
    *(ulong *)((local_250->m_backend).data._M_elems + 6) =
         CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                  local_2a8.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(local_250->m_backend).data._M_elems = local_2a8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((local_250->m_backend).data._M_elems + 2) =
         local_2a8.m_backend.data._M_elems._8_8_;
    (local_250->m_backend).exp = local_2a8.m_backend.exp;
    (local_250->m_backend).neg = local_2a8.m_backend.neg;
    (local_250->m_backend).fpclass = local_2a8.m_backend.fpclass;
    (local_250->m_backend).prec_elem = local_2a8.m_backend.prec_elem;
    local_264 = (int)local_260;
  }
  tVar9 = boost::multiprecision::operator<
                    (&local_2a8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1e8);
  if (!tVar9) goto LAB_0026aac0;
  goto LAB_0026aadf;
LAB_0026ab4e:
  uVar13 = uVar12 & 0xffffffff;
  do {
    uVar12 = uVar12 - 1;
    if ((int)uVar13 < 1) {
      if (local_264 < 0) {
        DVar10.info = 0;
        DVar10.idx = -1;
      }
      else {
        DVar10 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::coId((pSVar11->
                                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thesolver,local_264);
      }
      return (SPxId)DVar10;
    }
    pSVar4 = (pSVar11->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    iVar2 = (pSVar4->updateViols).super_IdxSet.idx[uVar12];
    if ((pSVar4->isInfeasible).data[iVar2] == 1) {
      uVar7 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
      local_2a8.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
      local_2a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
      local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_2a8.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
      local_2a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_2a8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
      local_2a8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
      local_2a8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
      local_2a8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
      result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      result.m_backend.exp = (tol->m_backend).exp;
      result.m_backend.neg = (tol->m_backend).neg;
      result.m_backend.fpclass = (tol->m_backend).fpclass;
      result.m_backend.prec_elem = (tol->m_backend).prec_elem;
      if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      local_260 = uVar12;
      tVar9 = boost::multiprecision::operator<(&local_2a8,&result);
      if (tVar9) {
        uStack_110 = CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                              local_2a8.m_backend.data._M_elems._24_5_);
        local_128 = (steeppr  [8])local_2a8.m_backend.data._M_elems._0_8_;
        auStack_120[0] = local_2a8.m_backend.data._M_elems[2];
        auStack_120[1] = local_2a8.m_backend.data._M_elems[3];
        local_118[0] = local_2a8.m_backend.data._M_elems[4];
        local_118[1] = local_2a8.m_backend.data._M_elems[5];
        local_108 = CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                             local_2a8.m_backend.data._M_elems._32_5_);
        local_100 = local_2a8.m_backend.exp;
        local_fc = local_2a8.m_backend.neg;
        local_f8 = local_2a8.m_backend.fpclass;
        iStack_f4 = local_2a8.m_backend.prec_elem;
        local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[iVar2].m_backend.data;
        local_168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar6[iVar2].m_backend.data + 0x10);
        local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 0x20);
        local_168.m_backend.exp = pnVar6[iVar2].m_backend.exp;
        local_168.m_backend.neg = pnVar6[iVar2].m_backend.neg;
        local_168.m_backend.fpclass = pnVar6[iVar2].m_backend.fpclass;
        local_168.m_backend.prec_elem = pnVar6[iVar2].m_backend.prec_elem;
        local_1a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_1a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 2);
        local_1a8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_1a8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_1a8.m_backend.exp = (tol->m_backend).exp;
        local_1a8.m_backend.neg = (tol->m_backend).neg;
        local_1a8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_1a8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_128,&local_168,&local_1a8,in_R8);
        local_2a8.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        local_2a8.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        local_2a8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_2a8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_2a8.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
        local_2a8.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
        local_2a8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_2a8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_2a8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_2a8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_2a8.m_backend.exp = result.m_backend.exp;
        local_2a8.m_backend.neg = result.m_backend.neg;
        local_2a8.m_backend.fpclass = result.m_backend.fpclass;
        local_2a8.m_backend.prec_elem = result.m_backend.prec_elem;
        tVar9 = boost::multiprecision::operator>
                          (&local_2a8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1e8);
        pSVar11 = local_258;
        uVar12 = local_260;
        if (tVar9) break;
      }
      else {
        (((local_258->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar2] = 0;
        uVar12 = local_260;
        pSVar11 = local_258;
      }
    }
    uVar13 = (ulong)((int)uVar13 - 1);
  } while( true );
  tVar9 = boost::multiprecision::operator>(&local_2a8,local_250);
  if (tVar9) {
    *(ulong *)((local_250->m_backend).data._M_elems + 8) =
         CONCAT35(local_2a8.m_backend.data._M_elems[9]._1_3_,
                  local_2a8.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((local_250->m_backend).data._M_elems + 4) =
         local_2a8.m_backend.data._M_elems._16_8_;
    *(ulong *)((local_250->m_backend).data._M_elems + 6) =
         CONCAT35(local_2a8.m_backend.data._M_elems[7]._1_3_,
                  local_2a8.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(local_250->m_backend).data._M_elems = local_2a8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((local_250->m_backend).data._M_elems + 2) =
         local_2a8.m_backend.data._M_elems._8_8_;
    (local_250->m_backend).exp = local_2a8.m_backend.exp;
    (local_250->m_backend).neg = local_2a8.m_backend.neg;
    (local_250->m_backend).fpclass = local_2a8.m_backend.fpclass;
    (local_250->m_backend).prec_elem = local_2a8.m_backend.prec_elem;
    local_264 = iVar2;
  }
  (((pSVar11->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thesolver)->isInfeasible).data[iVar2] = 2;
  DIdxSet::addIdx(this_00,iVar2);
  uVar12 = local_260;
  goto LAB_0026ab4e;
LAB_0026aac0:
  result.m_backend.data._M_elems._0_8_ = result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar9 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1e8,(int *)&result);
  if (tVar9) {
LAB_0026aadf:
    local_1e8.data._M_elems[9]._1_3_ = local_2a8.m_backend.data._M_elems[9]._1_3_;
    local_1e8.data._M_elems._32_5_ = local_2a8.m_backend.data._M_elems._32_5_;
    local_1e8.data._M_elems[0] = local_2a8.m_backend.data._M_elems[0];
    local_1e8.data._M_elems[1] = local_2a8.m_backend.data._M_elems[1];
    local_1e8.data._M_elems[2] = local_2a8.m_backend.data._M_elems[2];
    local_1e8.data._M_elems[3] = local_2a8.m_backend.data._M_elems[3];
    local_1e8.data._M_elems[4] = local_2a8.m_backend.data._M_elems[4];
    local_1e8.data._M_elems[5] = local_2a8.m_backend.data._M_elems[5];
    local_1e8.data._M_elems[7]._1_3_ = local_2a8.m_backend.data._M_elems[7]._1_3_;
    local_1e8.data._M_elems._24_5_ = local_2a8.m_backend.data._M_elems._24_5_;
    local_1e8.exp = local_2a8.m_backend.exp;
    local_1e8.neg = local_2a8.m_backend.neg;
    local_1e8.fpclass = local_2a8.m_backend.fpclass;
    local_1e8.prec_elem = local_2a8.m_backend.prec_elem;
  }
  goto LAB_0026a813;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperDim(R& best, R tol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = coTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = coTest[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}